

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

value_type __thiscall
andres::
BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
::operator()(BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
             *this,size_t c0,size_t c1,size_t c2)

{
  int iVar1;
  reference x;
  size_t c2_local;
  size_t c1_local;
  size_t c0_local;
  BinaryViewExpressionScalarSecond<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
  *this_local;
  
  x = View<int,false,std::allocator<unsigned_long>>::operator()
                ((View<int,false,std::allocator<unsigned_long>> *)this->e_,c0,c1,c2);
  iVar1 = marray_detail::Times<int,_int,_int>::operator()
                    ((Times<int,_int,_int> *)&this->field_0xc,x,&this->scalar_);
  return iVar1;
}

Assistant:

const value_type operator()(const std::size_t c0, const std::size_t c1, const std::size_t c2) const 
        { return binaryFunctor_(e_(c0, c1, c2), scalar_); }